

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

bool __thiscall gtar::Record::operator<(Record *this,Record *rhs)

{
  Behavior BVar1;
  Format FVar2;
  Behavior BVar3;
  Format FVar4;
  Resolution RVar5;
  Resolution RVar6;
  pointer pcVar7;
  bool bVar8;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar7 = (this->m_group)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar7,pcVar7 + (this->m_group)._M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar7 = (rhs->m_group)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar7,pcVar7 + (rhs->m_group)._M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar7 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar7,pcVar7 + (this->m_name)._M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar7 = (rhs->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar7,pcVar7 + (rhs->m_name)._M_string_length);
  BVar1 = this->m_behavior;
  FVar2 = this->m_format;
  BVar3 = rhs->m_behavior;
  FVar4 = rhs->m_format;
  RVar5 = this->m_resolution;
  RVar6 = rhs->m_resolution;
  iVar9 = std::__cxx11::string::compare((string *)&this->m_index);
  bVar8 = lthelper<std::__cxx11::string>
                    (&local_b0,&local_50,
                     (int)BVar1 < (int)BVar3 ||
                     BVar1 == BVar3 &&
                     ((int)FVar2 < (int)FVar4 ||
                     FVar2 == FVar4 && ((int)RVar5 < (int)RVar6 || RVar5 == RVar6 && iVar9 < 0)));
  bVar8 = lthelper<std::__cxx11::string>(&local_70,&local_90,bVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool Record::operator<(const Record &rhs) const
    {
        return lthelper(m_group, rhs.m_group,
               lthelper(m_name, rhs.m_name,
               lthelper(m_behavior, rhs.m_behavior,
               lthelper(m_format, rhs.m_format,
               lthelper(m_resolution, rhs.m_resolution,
                        m_index < rhs.m_index)))));
    }